

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.c
# Opt level: O3

void av1_convolve_x_sr_avx2
               (uint8_t *src,int32_t src_stride,uint8_t *dst,int32_t dst_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined1 (*pauVar4) [32];
  int iVar5;
  undefined1 (*pauVar6) [16];
  uint8_t *puVar7;
  undefined1 (*pauVar8) [32];
  int j;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  undefined1 (*pauVar16) [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined2 uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  
  auVar40 = _DAT_00568290;
  auVar17 = _DAT_00568280;
  auVar34 = _DAT_00568240;
  auVar67 = _DAT_00513e00;
  piVar1 = filter_params_x->filter_ptr;
  uVar11 = (ulong)((subpel_x_qn & 0xfU) * (uint)filter_params_x->taps);
  if (filter_params_x->taps == 0xc) {
    uVar2 = 7 - conv_params->round_0;
    auVar24 = ZEXT464(uVar2);
    uVar3 = *(undefined4 *)(piVar1 + uVar11);
    auVar112._4_4_ = uVar3;
    auVar112._0_4_ = uVar3;
    auVar112._8_4_ = uVar3;
    auVar112._12_4_ = uVar3;
    auVar112._16_4_ = uVar3;
    auVar112._20_4_ = uVar3;
    auVar112._24_4_ = uVar3;
    auVar112._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar1 + uVar11 + 2);
    auVar28._4_4_ = uVar3;
    auVar28._0_4_ = uVar3;
    auVar28._8_4_ = uVar3;
    auVar28._12_4_ = uVar3;
    auVar28._16_4_ = uVar3;
    auVar28._20_4_ = uVar3;
    auVar28._24_4_ = uVar3;
    auVar28._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar1 + uVar11 + 4);
    auVar110._4_4_ = uVar3;
    auVar110._0_4_ = uVar3;
    auVar110._8_4_ = uVar3;
    auVar110._12_4_ = uVar3;
    auVar110._16_4_ = uVar3;
    auVar110._20_4_ = uVar3;
    auVar110._24_4_ = uVar3;
    auVar110._28_4_ = uVar3;
    iVar5 = (1 << ((byte)uVar2 & 0x1f)) >> 1;
    uVar3 = *(undefined4 *)(piVar1 + uVar11 + 6);
    auVar49._4_4_ = uVar3;
    auVar49._0_4_ = uVar3;
    auVar49._8_4_ = uVar3;
    auVar49._12_4_ = uVar3;
    auVar49._16_4_ = uVar3;
    auVar49._20_4_ = uVar3;
    auVar49._24_4_ = uVar3;
    auVar49._28_4_ = uVar3;
    uVar3 = (undefined4)*(undefined8 *)(piVar1 + uVar11 + 8);
    auVar69._4_4_ = uVar3;
    auVar69._0_4_ = uVar3;
    auVar69._8_4_ = uVar3;
    auVar69._12_4_ = uVar3;
    auVar69._16_4_ = uVar3;
    auVar69._20_4_ = uVar3;
    auVar69._24_4_ = uVar3;
    auVar69._28_4_ = uVar3;
    uVar3 = (undefined4)((ulong)*(undefined8 *)(piVar1 + uVar11 + 8) >> 0x20);
    auVar82._4_4_ = uVar3;
    auVar82._0_4_ = uVar3;
    auVar82._8_4_ = uVar3;
    auVar82._12_4_ = uVar3;
    auVar82._16_4_ = uVar3;
    auVar82._20_4_ = uVar3;
    auVar82._24_4_ = uVar3;
    auVar82._28_4_ = uVar3;
    iVar15 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
    auVar93._4_4_ = iVar15;
    auVar93._0_4_ = iVar15;
    auVar93._8_4_ = iVar15;
    auVar93._12_4_ = iVar15;
    auVar93._16_4_ = iVar15;
    auVar93._20_4_ = iVar15;
    auVar93._24_4_ = iVar15;
    auVar93._28_4_ = iVar15;
    auVar101._4_4_ = iVar5;
    auVar101._0_4_ = iVar5;
    auVar101._8_4_ = iVar5;
    auVar101._12_4_ = iVar5;
    auVar101._16_4_ = iVar5;
    auVar101._20_4_ = iVar5;
    auVar101._24_4_ = iVar5;
    auVar101._28_4_ = iVar5;
    uVar10 = conv_params->round_0;
    if (w < 5) {
      if (0 < h) {
        pauVar6 = (undefined1 (*) [16])(src + -5);
        uVar11 = 0;
        do {
          auVar113._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
          auVar113._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
          auVar23 = vpunpcklbw_avx2(auVar113,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar39 = vpunpckhbw_avx2(auVar113,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar114 = vpshufd_avx2(auVar23,0xe6);
          auVar113 = vpshuflw_avx2(auVar114,0x50);
          auVar113 = vpshufhw_avx2(auVar113,0xfa);
          auVar31 = vpunpcklwd_avx2(auVar23,auVar23);
          auVar23 = vpalignr_avx2(auVar114,auVar31,2);
          auVar31 = vpalignr_avx2(auVar113,auVar31,10);
          auVar30 = vpunpcklwd_avx2(auVar39,auVar39);
          auVar114 = vpalignr_avx2(auVar39,auVar113,2);
          auVar113 = vpalignr_avx2(auVar30,auVar113,10);
          auVar39 = vpshufd_avx2(auVar39,0xe6);
          auVar50 = vpshuflw_avx2(auVar39,0x50);
          auVar50 = vpshufd_avx2(auVar50,0xf4);
          auVar39 = vpalignr_avx2(auVar39,auVar30,2);
          auVar50 = vpalignr_avx2(auVar50,auVar30,10);
          auVar114 = vpmaddwd_avx2(auVar114,auVar110);
          auVar113 = vpmaddwd_avx2(auVar113,auVar49);
          auVar114 = vpaddd_avx2(auVar114,auVar113);
          auVar113 = vpmaddwd_avx2(auVar39,auVar69);
          auVar39 = vpmaddwd_avx2(auVar50,auVar82);
          auVar113 = vpaddd_avx2(auVar113,auVar39);
          auVar23 = vpmaddwd_avx2(auVar23,auVar112);
          auVar31 = vpmaddwd_avx2(auVar28,auVar31);
          auVar23 = vpaddd_avx2(auVar23,auVar93);
          auVar23 = vpaddd_avx2(auVar23,auVar31);
          auVar114 = vpaddd_avx2(auVar23,auVar114);
          auVar114 = vpaddd_avx2(auVar114,auVar113);
          auVar114 = vpsrad_avx2(auVar114,ZEXT416(uVar10));
          auVar114 = vpaddd_avx2(auVar114,auVar101);
          auVar114 = vpsrad_avx2(auVar114,ZEXT416(uVar2));
          auVar114 = vpackssdw_avx2(auVar114,auVar114);
          auVar114 = vpackuswb_avx2(auVar114,auVar114);
          if (w < 3) {
            vpextrw_avx(auVar114._0_16_,0);
            vpextrw_avx(auVar114._16_16_,0);
          }
          else {
            *(int *)dst = auVar114._0_4_;
            *(int *)(dst + dst_stride) = auVar114._16_4_;
          }
          uVar11 = uVar11 + 2;
          dst = dst + (long)dst_stride * 2;
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + (long)src_stride * 2);
        } while (uVar11 < (uint)h);
      }
    }
    else if (0 < h) {
      puVar7 = src + -1;
      uVar11 = 0;
      do {
        uVar9 = 0;
        do {
          auVar114._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(puVar7 + uVar9) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar7 + (uVar9 - 4));
          auVar114._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar7 + uVar9);
          auVar23 = vpunpcklbw_avx2(auVar114,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar39 = vpunpckhbw_avx2(auVar114,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar114 = vpshufd_avx2(auVar23,0xe6);
          auVar113 = vpshuflw_avx2(auVar114,0x50);
          auVar113 = vpshufhw_avx2(auVar113,0xfa);
          auVar31 = vpunpcklwd_avx2(auVar23,auVar23);
          auVar23 = vpalignr_avx2(auVar114,auVar31,2);
          auVar31 = vpalignr_avx2(auVar113,auVar31,10);
          auVar30 = vpunpcklwd_avx2(auVar39,auVar39);
          auVar114 = vpalignr_avx2(auVar39,auVar113,2);
          auVar113 = vpalignr_avx2(auVar30,auVar113,10);
          auVar39 = vpshufd_avx2(auVar39,0xe6);
          auVar50 = vpshuflw_avx2(auVar39,0x50);
          auVar50 = vpshufd_avx2(auVar50,0xf4);
          auVar39 = vpalignr_avx2(auVar39,auVar30,2);
          auVar50 = vpalignr_avx2(auVar50,auVar30,10);
          auVar114 = vpmaddwd_avx2(auVar110,auVar114);
          auVar113 = vpmaddwd_avx2(auVar113,auVar49);
          auVar114 = vpaddd_avx2(auVar113,auVar114);
          auVar113 = vpmaddwd_avx2(auVar39,auVar69);
          auVar39 = vpmaddwd_avx2(auVar50,auVar82);
          auVar113 = vpaddd_avx2(auVar113,auVar39);
          auVar23 = vpmaddwd_avx2(auVar23,auVar112);
          auVar31 = vpmaddwd_avx2(auVar31,auVar28);
          auVar23 = vpaddd_avx2(auVar23,auVar93);
          auVar23 = vpaddd_avx2(auVar23,auVar31);
          auVar114 = vpaddd_avx2(auVar23,auVar114);
          auVar114 = vpaddd_avx2(auVar114,auVar113);
          auVar114 = vpsrad_avx2(auVar114,ZEXT416(uVar10));
          auVar114 = vpaddd_avx2(auVar101,auVar114);
          auVar114 = vpsrad_avx2(auVar114,auVar24._0_16_);
          auVar114 = vpackssdw_avx2(auVar114,auVar114);
          auVar114 = vpackuswb_avx2(auVar114,auVar114);
          auVar67 = vpunpckldq_avx(auVar114._0_16_,auVar114._16_16_);
          *(long *)(dst + uVar9) = auVar67._0_8_;
          uVar9 = uVar9 + 8;
        } while (uVar9 < (uint)w);
        uVar11 = uVar11 + 1;
        dst = dst + dst_stride;
        puVar7 = puVar7 + src_stride;
        auVar24 = ZEXT1664(auVar24._0_16_);
      } while (uVar11 != (uint)h);
    }
  }
  else if (piVar1[uVar11 + 7] == 0 && piVar1[uVar11] == 0) {
    if (piVar1[uVar11 + 6] == 0 && piVar1[uVar11 + 1] == 0) {
      if (piVar1[uVar11 + 5] == 0 && piVar1[uVar11 + 2] == 0) {
        if (subpel_x_qn == 8) {
          lVar12 = (long)src_stride;
          if (w < 0x10) {
            if (w == 2) {
              do {
                auVar67 = vpunpckldq_avx(ZEXT416(*(uint *)src),
                                         ZEXT416(*(uint *)((long)src + lVar12)));
                auVar17._0_8_ = auVar67._0_8_;
                auVar17._8_8_ = 0;
                auVar67 = vpsrlq_avx(auVar17,8);
                auVar67 = vpavgb_avx(auVar17,auVar67);
                vpextrw_avx(auVar67,0);
                vpextrw_avx(auVar67,2);
                src = (uint8_t *)((long)src + (long)(src_stride * 2));
                h = h + -2;
              } while (h != 0);
              return;
            }
            if (w == 4) {
              do {
                auVar18._8_8_ = 0;
                auVar18._0_8_ = *(ulong *)src;
                auVar67 = vmovhps_avx(auVar18,*(undefined8 *)((long)src + lVar12));
                auVar34 = vpsrlq_avx(auVar67,8);
                auVar67 = vpavgb_avx(auVar67,auVar34);
                *(int *)dst = auVar67._0_4_;
                *(int *)(dst + dst_stride) = auVar67._8_4_;
                src = (uint8_t *)((long)src + (long)(src_stride * 2));
                dst = dst + dst_stride * 2;
                h = h + -2;
              } while (h != 0);
              return;
            }
            if (w == 8) {
              do {
                auVar67 = vpsrldq_avx(*(undefined1 (*) [16])src,1);
                auVar34 = vpsrldq_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar12),1);
                auVar67 = vpavgb_avx(*(undefined1 (*) [16])src,auVar67);
                auVar34 = vpavgb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar12),
                                     auVar34);
                *(long *)dst = auVar67._0_8_;
                *(long *)(dst + dst_stride) = auVar34._0_8_;
                src = *(undefined1 (*) [16])src + src_stride * 2;
                dst = dst + dst_stride * 2;
                h = h + -2;
              } while (h != 0);
              return;
            }
          }
          else {
            if (w == 0x10) {
              pauVar6 = (undefined1 (*) [16])(src + 1);
              do {
                auVar67 = vpavgb_avx(*(undefined1 (*) [16])(pauVar6[-1] + 0xf),*pauVar6);
                auVar34 = vpavgb_avx(*(undefined1 (*) [16])(pauVar6[-1] + lVar12 + 0xf),
                                     *(undefined1 (*) [16])(*pauVar6 + lVar12));
                *(undefined1 (*) [16])dst = auVar67;
                *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar34;
                dst = *(undefined1 (*) [16])dst + dst_stride * 2;
                pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
                h = h + -2;
              } while (h != 0);
              return;
            }
            if (w == 0x20) {
              pauVar4 = (undefined1 (*) [32])(src + 1);
              do {
                auVar112 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar4[-1] + 0x1f),*pauVar4);
                *(undefined1 (*) [32])dst = auVar112;
                dst = *(undefined1 (*) [32])dst + dst_stride;
                pauVar4 = (undefined1 (*) [32])(*pauVar4 + lVar12);
                h = h + -1;
              } while (h != 0);
              return;
            }
            if (w == 0x40) {
              pauVar8 = (undefined1 (*) [32])(src + 0x21);
              pauVar4 = (undefined1 (*) [32])(dst + 0x20);
              do {
                auVar112 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
                pauVar4[-1] = auVar112;
                auVar112 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
                *pauVar4 = auVar112;
                pauVar8 = (undefined1 (*) [32])(*pauVar8 + lVar12);
                pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
                h = h + -1;
              } while (h != 0);
              return;
            }
          }
          pauVar8 = (undefined1 (*) [32])(src + 0x61);
          pauVar4 = (undefined1 (*) [32])(dst + 0x60);
          do {
            auVar112 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-4] + 0x1f),pauVar8[-3]);
            pauVar4[-3] = auVar112;
            auVar112 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-3] + 0x1f),pauVar8[-2]);
            pauVar4[-2] = auVar112;
            auVar112 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
            pauVar4[-1] = auVar112;
            auVar112 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
            *pauVar4 = auVar112;
            pauVar8 = (undefined1 (*) [32])(*pauVar8 + lVar12);
            pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
            h = h + -1;
          } while (h != 0);
        }
        else if (w < 9) {
          auVar17 = vpsrlw_avx(ZEXT416(*(uint *)(piVar1 + uVar11 + 3)),1);
          auVar17 = vpshufb_avx(auVar17,_DAT_00513960);
          lVar12 = (long)src_stride;
          lVar13 = (long)(src_stride * 2);
          if (w == 2) {
            auVar67._8_2_ = 0x22;
            auVar67._0_8_ = 0x22002200220022;
            auVar67._10_2_ = 0x22;
            auVar67._12_2_ = 0x22;
            auVar67._14_2_ = 0x22;
            do {
              auVar34 = vpinsrd_avx(ZEXT416(*(uint *)src),*(undefined4 *)((long)src + lVar12),1);
              auVar34 = vpshufb_avx(auVar34,ZEXT816(0x605050402010100));
              auVar34 = vpmaddubsw_avx(auVar34,auVar17);
              auVar34 = vpaddw_avx(auVar34,auVar67);
              auVar34 = vpsraw_avx(auVar34,6);
              auVar34 = vpackuswb_avx(auVar34,auVar34);
              vpextrw_avx(auVar34,0);
              vpextrw_avx(auVar34,1);
              src = (uint8_t *)((long)src + lVar13);
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 4) {
            auVar40._8_2_ = 0x22;
            auVar40._0_8_ = 0x22002200220022;
            auVar40._10_2_ = 0x22;
            auVar40._12_2_ = 0x22;
            auVar40._14_2_ = 0x22;
            do {
              auVar25._8_8_ = 0;
              auVar25._0_8_ = *(ulong *)src;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = *(ulong *)((long)src + lVar12);
              auVar67 = vpunpcklbw_avx(auVar25,auVar52);
              auVar67 = vpshufb_avx(auVar67,auVar34);
              auVar67 = vpmaddubsw_avx(auVar67,auVar17);
              auVar67 = vpaddw_avx(auVar67,auVar40);
              auVar67 = vpsraw_avx(auVar67,6);
              auVar67 = vpackuswb_avx(auVar67,auVar67);
              *(int *)dst = auVar67._0_4_;
              iVar5 = vpextrw_avx(auVar67,3);
              uVar10 = vpextrw_avx(auVar67,2);
              *(uint *)(dst + dst_stride) = uVar10 | iVar5 << 0x10;
              src = (uint8_t *)((long)src + lVar13);
              dst = dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
          else {
            auVar34._8_2_ = 0x22;
            auVar34._0_8_ = 0x22002200220022;
            auVar34._10_2_ = 0x22;
            auVar34._12_2_ = 0x22;
            auVar34._14_2_ = 0x22;
            do {
              auVar40 = vpshufb_avx(*(undefined1 (*) [16])src,auVar67);
              auVar25 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar12),
                                    auVar67);
              auVar40 = vpmaddubsw_avx(auVar40,auVar17);
              auVar25 = vpmaddubsw_avx(auVar25,auVar17);
              auVar40 = vpaddw_avx(auVar40,auVar34);
              auVar40 = vpsraw_avx(auVar40,6);
              auVar40 = vpackuswb_avx(auVar40,auVar40);
              auVar25 = vpaddw_avx(auVar25,auVar34);
              auVar25 = vpsraw_avx(auVar25,6);
              auVar25 = vpackuswb_avx(auVar25,auVar25);
              *(long *)dst = auVar40._0_8_;
              *(long *)(dst + dst_stride) = auVar25._0_8_;
              src = *(undefined1 (*) [16])src + lVar13;
              dst = dst + dst_stride * 2;
              h = h + -2;
            } while (h != 0);
          }
        }
        else {
          auVar67 = ZEXT416(*(uint *)(piVar1 + uVar11 + 3));
          auVar23._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar67;
          auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
          auVar112 = vpsrlw_avx2(auVar23,1);
          auVar112 = vpshufb_avx2(auVar112,_DAT_00568220);
          if (w == 0x10) {
            pauVar6 = (undefined1 (*) [16])(src + 1);
            auVar31._8_2_ = 0x22;
            auVar31._0_8_ = 0x22002200220022;
            auVar31._10_2_ = 0x22;
            auVar31._12_2_ = 0x22;
            auVar31._14_2_ = 0x22;
            auVar31._16_2_ = 0x22;
            auVar31._18_2_ = 0x22;
            auVar31._20_2_ = 0x22;
            auVar31._22_2_ = 0x22;
            auVar31._24_2_ = 0x22;
            auVar31._26_2_ = 0x22;
            auVar31._28_2_ = 0x22;
            auVar31._30_2_ = 0x22;
            do {
              auVar39._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 0xf) +
                   ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + 0xf);
              auVar39._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 0xf);
              auVar50._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) +
                   ZEXT116(1) * *pauVar6;
              auVar50._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
              auVar28 = vpunpcklbw_avx2(auVar39,auVar50);
              auVar110 = vpunpckhbw_avx2(auVar39,auVar50);
              auVar28 = vpmaddubsw_avx2(auVar28,auVar112);
              auVar110 = vpmaddubsw_avx2(auVar110,auVar112);
              auVar28 = vpaddw_avx2(auVar28,auVar31);
              auVar49 = vpsraw_avx2(auVar28,6);
              auVar28 = vpaddw_avx2(auVar110,auVar31);
              auVar28 = vpsraw_avx2(auVar28,6);
              auVar28 = vpackuswb_avx2(auVar49,auVar28);
              *(undefined1 (*) [16])dst = auVar28._0_16_;
              *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar28._16_16_;
              dst = *(undefined1 (*) [16])dst + dst_stride * 2;
              pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
              h = h + -2;
            } while (h != 0);
          }
          else if (w == 0x20) {
            pauVar4 = (undefined1 (*) [32])(src + 1);
            auVar30._8_2_ = 0x22;
            auVar30._0_8_ = 0x22002200220022;
            auVar30._10_2_ = 0x22;
            auVar30._12_2_ = 0x22;
            auVar30._14_2_ = 0x22;
            auVar30._16_2_ = 0x22;
            auVar30._18_2_ = 0x22;
            auVar30._20_2_ = 0x22;
            auVar30._22_2_ = 0x22;
            auVar30._24_2_ = 0x22;
            auVar30._26_2_ = 0x22;
            auVar30._28_2_ = 0x22;
            auVar30._30_2_ = 0x22;
            do {
              auVar28 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar4[-1] + 0x1f),*pauVar4);
              auVar110 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar4[-1] + 0x1f),*pauVar4);
              auVar28 = vpmaddubsw_avx2(auVar28,auVar112);
              auVar110 = vpmaddubsw_avx2(auVar110,auVar112);
              auVar28 = vpaddw_avx2(auVar28,auVar30);
              auVar49 = vpsraw_avx2(auVar28,6);
              auVar28 = vpaddw_avx2(auVar110,auVar30);
              auVar28 = vpsraw_avx2(auVar28,6);
              auVar28 = vpackuswb_avx2(auVar49,auVar28);
              *(undefined1 (*) [32])dst = auVar28;
              dst = *(undefined1 (*) [32])dst + dst_stride;
              pauVar4 = (undefined1 (*) [32])(*pauVar4 + src_stride);
              h = h + -1;
            } while (h != 0);
          }
          else if (w == 0x40) {
            pauVar8 = (undefined1 (*) [32])(src + 0x21);
            pauVar4 = (undefined1 (*) [32])(dst + 0x20);
            auVar29._8_2_ = 0x22;
            auVar29._0_8_ = 0x22002200220022;
            auVar29._10_2_ = 0x22;
            auVar29._12_2_ = 0x22;
            auVar29._14_2_ = 0x22;
            auVar29._16_2_ = 0x22;
            auVar29._18_2_ = 0x22;
            auVar29._20_2_ = 0x22;
            auVar29._22_2_ = 0x22;
            auVar29._24_2_ = 0x22;
            auVar29._26_2_ = 0x22;
            auVar29._28_2_ = 0x22;
            auVar29._30_2_ = 0x22;
            do {
              auVar28 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
              auVar110 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
              auVar28 = vpmaddubsw_avx2(auVar28,auVar112);
              auVar110 = vpmaddubsw_avx2(auVar110,auVar112);
              auVar28 = vpaddw_avx2(auVar28,auVar29);
              auVar49 = vpsraw_avx2(auVar28,6);
              auVar28 = vpaddw_avx2(auVar110,auVar29);
              auVar28 = vpsraw_avx2(auVar28,6);
              auVar28 = vpackuswb_avx2(auVar49,auVar28);
              pauVar4[-1] = auVar28;
              auVar28 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
              auVar110 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
              auVar28 = vpmaddubsw_avx2(auVar28,auVar112);
              auVar110 = vpmaddubsw_avx2(auVar110,auVar112);
              auVar28 = vpaddw_avx2(auVar28,auVar29);
              auVar49 = vpsraw_avx2(auVar28,6);
              auVar28 = vpaddw_avx2(auVar110,auVar29);
              auVar28 = vpsraw_avx2(auVar28,6);
              auVar28 = vpackuswb_avx2(auVar49,auVar28);
              *pauVar4 = auVar28;
              pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
              pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
              h = h + -1;
            } while (h != 0);
          }
          else {
            pauVar8 = (undefined1 (*) [32])(src + 0x61);
            pauVar4 = (undefined1 (*) [32])(dst + 0x60);
            auVar32._8_2_ = 0x22;
            auVar32._0_8_ = 0x22002200220022;
            auVar32._10_2_ = 0x22;
            auVar32._12_2_ = 0x22;
            auVar32._14_2_ = 0x22;
            auVar32._16_2_ = 0x22;
            auVar32._18_2_ = 0x22;
            auVar32._20_2_ = 0x22;
            auVar32._22_2_ = 0x22;
            auVar32._24_2_ = 0x22;
            auVar32._26_2_ = 0x22;
            auVar32._28_2_ = 0x22;
            auVar32._30_2_ = 0x22;
            do {
              auVar28 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-4] + 0x1f),pauVar8[-3]);
              auVar110 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-4] + 0x1f),pauVar8[-3]);
              auVar28 = vpmaddubsw_avx2(auVar28,auVar112);
              auVar110 = vpmaddubsw_avx2(auVar110,auVar112);
              auVar28 = vpaddw_avx2(auVar28,auVar32);
              auVar49 = vpsraw_avx2(auVar28,6);
              auVar28 = vpaddw_avx2(auVar110,auVar32);
              auVar28 = vpsraw_avx2(auVar28,6);
              auVar28 = vpackuswb_avx2(auVar49,auVar28);
              pauVar4[-3] = auVar28;
              auVar28 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-3] + 0x1f),pauVar8[-2]);
              auVar110 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-3] + 0x1f),pauVar8[-2]);
              auVar28 = vpmaddubsw_avx2(auVar28,auVar112);
              auVar110 = vpmaddubsw_avx2(auVar110,auVar112);
              auVar28 = vpaddw_avx2(auVar28,auVar32);
              auVar49 = vpsraw_avx2(auVar28,6);
              auVar28 = vpaddw_avx2(auVar110,auVar32);
              auVar28 = vpsraw_avx2(auVar28,6);
              auVar28 = vpackuswb_avx2(auVar49,auVar28);
              pauVar4[-2] = auVar28;
              auVar28 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
              auVar110 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-2] + 0x1f),pauVar8[-1]);
              auVar28 = vpmaddubsw_avx2(auVar28,auVar112);
              auVar110 = vpmaddubsw_avx2(auVar110,auVar112);
              auVar28 = vpaddw_avx2(auVar28,auVar32);
              auVar49 = vpsraw_avx2(auVar28,6);
              auVar28 = vpaddw_avx2(auVar110,auVar32);
              auVar28 = vpsraw_avx2(auVar28,6);
              auVar28 = vpackuswb_avx2(auVar49,auVar28);
              pauVar4[-1] = auVar28;
              auVar28 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
              auVar110 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar8[-1] + 0x1f),*pauVar8);
              auVar28 = vpmaddubsw_avx2(auVar28,auVar112);
              auVar110 = vpmaddubsw_avx2(auVar110,auVar112);
              auVar28 = vpaddw_avx2(auVar28,auVar32);
              auVar49 = vpsraw_avx2(auVar28,6);
              auVar28 = vpaddw_avx2(auVar110,auVar32);
              auVar28 = vpsraw_avx2(auVar28,6);
              auVar28 = vpackuswb_avx2(auVar49,auVar28);
              *pauVar4 = auVar28;
              pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
              pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
              h = h + -1;
            } while (h != 0);
          }
        }
      }
      else {
        auVar67 = *(undefined1 (*) [16])(piVar1 + uVar11);
        auVar25 = vpsraw_avx(auVar67,1);
        auVar34 = vpshufb_avx(auVar25,_DAT_005139b0);
        pauVar6 = (undefined1 (*) [16])(src + -1);
        auVar25 = vpshufb_avx(auVar25,_DAT_00513980);
        if (w == 2) {
          auVar53._8_2_ = 0x22;
          auVar53._0_8_ = 0x22002200220022;
          auVar53._10_2_ = 0x22;
          auVar53._12_2_ = 0x22;
          auVar53._14_2_ = 0x22;
          do {
            auVar68._8_8_ = 0;
            auVar68._0_8_ = *(ulong *)*pauVar6;
            auVar67 = vmovhps_avx(auVar68,*(undefined8 *)(*pauVar6 + src_stride));
            auVar17 = vpshufb_avx(auVar67,ZEXT816(0xa09090802010100));
            auVar40 = vpshufb_avx(auVar67,ZEXT816(0xc0b0b0a04030302));
            auVar67 = vpmaddubsw_avx(auVar17,auVar34);
            auVar17 = vpmaddubsw_avx(auVar40,auVar25);
            auVar67 = vpaddw_avx(auVar67,auVar17);
            auVar67 = vpaddw_avx(auVar67,auVar53);
            auVar67 = vpsraw_avx(auVar67,6);
            auVar67 = vpackuswb_avx(auVar67,auVar67);
            vpextrw_avx(auVar67,0);
            vpextrw_avx(auVar67,1);
            pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
            h = h + -2;
          } while (h != 0);
        }
        else if (w == 8) {
          if (0 < h) {
            auVar21._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar67;
            auVar21._16_16_ = ZEXT116(1) * auVar67;
            auVar28 = vpsraw_avx2(auVar21,1);
            auVar112 = vpshufb_avx2(auVar28,_DAT_00568160);
            auVar28 = vpshufb_avx2(auVar28,_DAT_00568180);
            uVar11 = 0;
            auVar37._16_16_ = _DAT_00513e00;
            auVar37._0_16_ = _DAT_00513e00;
            auVar47._16_16_ = _DAT_005139e0;
            auVar47._0_16_ = _DAT_005139e0;
            auVar64._8_2_ = 0x22;
            auVar64._0_8_ = 0x22002200220022;
            auVar64._10_2_ = 0x22;
            auVar64._12_2_ = 0x22;
            auVar64._14_2_ = 0x22;
            auVar64._16_2_ = 0x22;
            auVar64._18_2_ = 0x22;
            auVar64._20_2_ = 0x22;
            auVar64._22_2_ = 0x22;
            auVar64._24_2_ = 0x22;
            auVar64._26_2_ = 0x22;
            auVar64._28_2_ = 0x22;
            auVar64._30_2_ = 0x22;
            do {
              auVar80._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) +
                   ZEXT116(1) * *pauVar6;
              auVar80._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
              auVar110 = vpshufb_avx2(auVar80,auVar37);
              auVar110 = vpmaddubsw_avx2(auVar110,auVar112);
              auVar49 = vpshufb_avx2(auVar80,auVar47);
              auVar49 = vpmaddubsw_avx2(auVar49,auVar28);
              auVar110 = vpaddw_avx2(auVar110,auVar49);
              auVar110 = vpaddw_avx2(auVar110,auVar64);
              auVar110 = vpsraw_avx2(auVar110,6);
              auVar110 = vpackuswb_avx2(auVar110,auVar112);
              *(long *)dst = auVar110._0_8_;
              *(long *)(dst + dst_stride) = auVar110._16_8_;
              uVar11 = uVar11 + 2;
              pauVar6 = (undefined1 (*) [16])(*pauVar6 + (long)src_stride * 2);
              dst = dst + (long)dst_stride * 2;
            } while (uVar11 < (uint)h);
          }
        }
        else if (w == 4) {
          auVar51._8_2_ = 0x22;
          auVar51._0_8_ = 0x22002200220022;
          auVar51._10_2_ = 0x22;
          auVar51._12_2_ = 0x22;
          auVar51._14_2_ = 0x22;
          do {
            auVar66._8_8_ = 0;
            auVar66._0_8_ = *(ulong *)*pauVar6;
            auVar67 = vmovhps_avx(auVar66,*(undefined8 *)(*pauVar6 + src_stride));
            auVar52 = vpshufb_avx(auVar67,auVar17);
            auVar18 = vpshufb_avx(auVar67,auVar40);
            auVar67 = vpmaddubsw_avx(auVar52,auVar34);
            auVar52 = vpmaddubsw_avx(auVar18,auVar25);
            auVar67 = vpaddw_avx(auVar67,auVar52);
            auVar67 = vpaddw_avx(auVar67,auVar51);
            auVar67 = vpsraw_avx(auVar67,6);
            auVar67 = vpackuswb_avx(auVar67,auVar67);
            *(int *)dst = auVar67._0_4_;
            iVar5 = vpextrw_avx(auVar67,3);
            uVar10 = vpextrw_avx(auVar67,2);
            *(uint *)(dst + dst_stride) = uVar10 | iVar5 << 0x10;
            pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
            dst = dst + dst_stride * 2;
            h = h + -2;
          } while (h != 0);
        }
        else if (0 < h) {
          auVar22._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar67;
          auVar22._16_16_ = ZEXT116(1) * auVar67;
          auVar28 = vpsraw_avx2(auVar22,1);
          auVar112 = vpshufb_avx2(auVar28,_DAT_00568160);
          auVar28 = vpshufb_avx2(auVar28,_DAT_00568180);
          lVar12 = 0x800000000;
          uVar11 = 0;
          auVar38._16_16_ = _DAT_00513e00;
          auVar38._0_16_ = _DAT_00513e00;
          auVar48._16_16_ = _DAT_005139e0;
          auVar48._0_16_ = _DAT_005139e0;
          auVar65._8_2_ = 0x22;
          auVar65._0_8_ = 0x22002200220022;
          auVar65._10_2_ = 0x22;
          auVar65._12_2_ = 0x22;
          auVar65._14_2_ = 0x22;
          auVar65._16_2_ = 0x22;
          auVar65._18_2_ = 0x22;
          auVar65._20_2_ = 0x22;
          auVar65._22_2_ = 0x22;
          auVar65._24_2_ = 0x22;
          auVar65._26_2_ = 0x22;
          auVar65._28_2_ = 0x22;
          auVar65._30_2_ = 0x22;
          pauVar16 = pauVar6;
          do {
            if (0 < w) {
              lVar14 = 0;
              lVar13 = lVar12;
              do {
                auVar81._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + (lVar13 >> 0x20)) +
                     ZEXT116(1) * SUB3216(*(undefined1 (*) [32])(*pauVar16 + lVar14),0);
                auVar81._16_16_ =
                     ZEXT116(0) * SUB3216(*(undefined1 (*) [32])(*pauVar16 + lVar14),0x10) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + (lVar13 >> 0x20));
                auVar110 = vpshufb_avx2(auVar81,auVar38);
                auVar110 = vpmaddubsw_avx2(auVar110,auVar112);
                auVar49 = vpshufb_avx2(auVar81,auVar48);
                auVar49 = vpmaddubsw_avx2(auVar49,auVar28);
                auVar110 = vpaddw_avx2(auVar110,auVar49);
                auVar110 = vpaddw_avx2(auVar110,auVar65);
                auVar110 = vpsraw_avx2(auVar110,6);
                auVar67 = vpackuswb_avx(auVar110._0_16_,auVar110._16_16_);
                *(undefined1 (*) [16])(dst + lVar14) = auVar67;
                lVar14 = lVar14 + 0x10;
                lVar13 = lVar13 + 0x1000000000;
              } while (lVar14 < w);
            }
            uVar11 = uVar11 + 1;
            dst = dst + dst_stride;
            pauVar16 = (undefined1 (*) [16])(*pauVar16 + src_stride);
            lVar12 = lVar12 + ((long)src_stride << 0x20);
          } while (uVar11 != (uint)h);
        }
      }
    }
    else {
      auVar34 = vpsraw_avx(*(undefined1 (*) [16])(piVar1 + uVar11),1);
      auVar67 = vpshufb_avx(auVar34,_DAT_005682c0);
      auVar20._0_2_ = auVar67._0_2_;
      auVar20._2_2_ = auVar20._0_2_;
      auVar20._4_2_ = auVar20._0_2_;
      auVar20._6_2_ = auVar20._0_2_;
      auVar20._8_2_ = auVar20._0_2_;
      auVar20._10_2_ = auVar20._0_2_;
      auVar20._12_2_ = auVar20._0_2_;
      auVar20._14_2_ = auVar20._0_2_;
      auVar20._16_2_ = auVar20._0_2_;
      auVar20._18_2_ = auVar20._0_2_;
      auVar20._20_2_ = auVar20._0_2_;
      auVar20._22_2_ = auVar20._0_2_;
      auVar20._24_2_ = auVar20._0_2_;
      auVar20._26_2_ = auVar20._0_2_;
      auVar20._28_2_ = auVar20._0_2_;
      auVar20._30_2_ = auVar20._0_2_;
      auVar67 = vpshufb_avx(auVar34,_DAT_005682d0);
      auVar34 = vpshufb_avx(auVar34,_DAT_005682e0);
      uVar33 = auVar67._0_2_;
      auVar27._2_2_ = uVar33;
      auVar27._0_2_ = uVar33;
      auVar27._4_2_ = uVar33;
      auVar27._6_2_ = uVar33;
      auVar27._8_2_ = uVar33;
      auVar27._10_2_ = uVar33;
      auVar27._12_2_ = uVar33;
      auVar27._14_2_ = uVar33;
      auVar27._16_2_ = uVar33;
      auVar27._18_2_ = uVar33;
      auVar27._20_2_ = uVar33;
      auVar27._22_2_ = uVar33;
      auVar27._24_2_ = uVar33;
      auVar27._26_2_ = uVar33;
      auVar27._28_2_ = uVar33;
      auVar27._30_2_ = uVar33;
      uVar33 = auVar34._0_2_;
      auVar36._2_2_ = uVar33;
      auVar36._0_2_ = uVar33;
      auVar36._4_2_ = uVar33;
      auVar36._6_2_ = uVar33;
      auVar36._8_2_ = uVar33;
      auVar36._10_2_ = uVar33;
      auVar36._12_2_ = uVar33;
      auVar36._14_2_ = uVar33;
      auVar36._16_2_ = uVar33;
      auVar36._18_2_ = uVar33;
      auVar36._20_2_ = uVar33;
      auVar36._22_2_ = uVar33;
      auVar36._24_2_ = uVar33;
      auVar36._26_2_ = uVar33;
      auVar36._28_2_ = uVar33;
      auVar36._30_2_ = uVar33;
      switch(w << 0x1d | w - 8U >> 3) {
      case 0:
        pauVar6 = (undefined1 (*) [16])(src + -2);
        auVar42._16_16_ = _DAT_00513e00;
        auVar42._0_16_ = _DAT_00513e00;
        auVar55._16_16_ = _DAT_005139e0;
        auVar55._0_16_ = _DAT_005139e0;
        auVar71._16_16_ = _DAT_005139f0;
        auVar71._0_16_ = _DAT_005139f0;
        auVar84._8_2_ = 0x22;
        auVar84._0_8_ = 0x22002200220022;
        auVar84._10_2_ = 0x22;
        auVar84._12_2_ = 0x22;
        auVar84._14_2_ = 0x22;
        auVar84._16_2_ = 0x22;
        auVar84._18_2_ = 0x22;
        auVar84._20_2_ = 0x22;
        auVar84._22_2_ = 0x22;
        auVar84._24_2_ = 0x22;
        auVar84._26_2_ = 0x22;
        auVar84._28_2_ = 0x22;
        auVar84._30_2_ = 0x22;
        do {
          auVar95._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
          auVar95._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
          auVar112 = vpshufb_avx2(auVar95,auVar42);
          auVar28 = vpshufb_avx2(auVar95,auVar55);
          auVar110 = vpshufb_avx2(auVar95,auVar71);
          auVar112 = vpmaddubsw_avx2(auVar112,auVar20);
          auVar28 = vpmaddubsw_avx2(auVar28,auVar27);
          auVar112 = vpaddw_avx2(auVar112,auVar28);
          auVar28 = vpmaddubsw_avx2(auVar110,auVar36);
          auVar28 = vpaddw_avx2(auVar28,auVar84);
          auVar112 = vpaddw_avx2(auVar112,auVar28);
          auVar112 = vpsraw_avx2(auVar112,6);
          auVar112 = vpackuswb_avx2(auVar112,auVar20);
          *(long *)dst = auVar112._0_8_;
          *(long *)(dst + dst_stride) = auVar112._16_8_;
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
          dst = dst + dst_stride * 2;
          h = h + -2;
        } while (h != 0);
        break;
      case 1:
        pauVar6 = (undefined1 (*) [16])(src + 6);
        auVar44._16_16_ = _DAT_00513e00;
        auVar44._0_16_ = _DAT_00513e00;
        auVar61._16_16_ = _DAT_005139e0;
        auVar61._0_16_ = _DAT_005139e0;
        auVar77._16_16_ = _DAT_005139f0;
        auVar77._0_16_ = _DAT_005139f0;
        auVar90._8_2_ = 0x22;
        auVar90._0_8_ = 0x22002200220022;
        auVar90._10_2_ = 0x22;
        auVar90._12_2_ = 0x22;
        auVar90._14_2_ = 0x22;
        auVar90._16_2_ = 0x22;
        auVar90._18_2_ = 0x22;
        auVar90._20_2_ = 0x22;
        auVar90._22_2_ = 0x22;
        auVar90._24_2_ = 0x22;
        auVar90._26_2_ = 0x22;
        auVar90._28_2_ = 0x22;
        auVar90._30_2_ = 0x22;
        do {
          auVar100._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 8) +
               ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + 8);
          auVar100._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 8);
          auVar112 = vpshufb_avx2(auVar100,auVar44);
          auVar28 = vpshufb_avx2(auVar100,auVar61);
          auVar110 = vpshufb_avx2(auVar100,auVar77);
          auVar112 = vpmaddubsw_avx2(auVar112,auVar20);
          auVar28 = vpmaddubsw_avx2(auVar28,auVar27);
          auVar112 = vpaddw_avx2(auVar112,auVar28);
          auVar107._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
          auVar107._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
          auVar110 = vpmaddubsw_avx2(auVar110,auVar36);
          auVar28 = vpshufb_avx2(auVar107,auVar44);
          auVar49 = vpshufb_avx2(auVar107,auVar61);
          auVar69 = vpshufb_avx2(auVar107,auVar77);
          auVar28 = vpmaddubsw_avx2(auVar28,auVar20);
          auVar49 = vpmaddubsw_avx2(auVar49,auVar27);
          auVar28 = vpaddw_avx2(auVar28,auVar49);
          auVar49 = vpmaddubsw_avx2(auVar69,auVar36);
          auVar110 = vpaddw_avx2(auVar110,auVar90);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpsraw_avx2(auVar112,6);
          auVar112 = vpaddw_avx2(auVar49,auVar90);
          auVar112 = vpaddw_avx2(auVar28,auVar112);
          auVar112 = vpsraw_avx2(auVar112,6);
          auVar112 = vpackuswb_avx2(auVar110,auVar112);
          *(undefined1 (*) [16])dst = auVar112._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar112._16_16_;
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
          h = h + -2;
        } while (h != 0);
        break;
      default:
        pauVar8 = (undefined1 (*) [32])(src + 0x66);
        pauVar4 = (undefined1 (*) [32])(dst + 0x60);
        auVar46._16_16_ = _DAT_00513e00;
        auVar46._0_16_ = _DAT_00513e00;
        auVar63._16_16_ = _DAT_005139e0;
        auVar63._0_16_ = _DAT_005139e0;
        auVar79._16_16_ = _DAT_005139f0;
        auVar79._0_16_ = _DAT_005139f0;
        auVar92._8_2_ = 0x22;
        auVar92._0_8_ = 0x22002200220022;
        auVar92._10_2_ = 0x22;
        auVar92._12_2_ = 0x22;
        auVar92._14_2_ = 0x22;
        auVar92._16_2_ = 0x22;
        auVar92._18_2_ = 0x22;
        auVar92._20_2_ = 0x22;
        auVar92._22_2_ = 0x22;
        auVar92._24_2_ = 0x22;
        auVar92._26_2_ = 0x22;
        auVar92._28_2_ = 0x22;
        auVar92._30_2_ = 0x22;
        do {
          auVar112 = *(undefined1 (*) [32])(pauVar8[-4] + 0x18);
          auVar28 = pauVar8[-3];
          auVar110 = vpshufb_avx2(auVar112,auVar46);
          auVar49 = vpshufb_avx2(auVar112,auVar63);
          auVar69 = vpshufb_avx2(auVar112,auVar79);
          auVar112 = vpmaddubsw_avx2(auVar110,auVar20);
          auVar110 = vpmaddubsw_avx2(auVar49,auVar27);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpmaddubsw_avx2(auVar69,auVar36);
          auVar49 = vpshufb_avx2(auVar28,auVar46);
          auVar69 = vpshufb_avx2(auVar28,auVar63);
          auVar82 = vpshufb_avx2(auVar28,auVar79);
          auVar28 = vpmaddubsw_avx2(auVar49,auVar20);
          auVar49 = vpmaddubsw_avx2(auVar69,auVar27);
          auVar28 = vpaddw_avx2(auVar28,auVar49);
          auVar49 = vpmaddubsw_avx2(auVar82,auVar36);
          auVar110 = vpaddw_avx2(auVar110,auVar92);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpsraw_avx2(auVar112,6);
          auVar112 = vpaddw_avx2(auVar49,auVar92);
          auVar112 = vpaddw_avx2(auVar28,auVar112);
          auVar112 = vpsraw_avx2(auVar112,6);
          auVar112 = vpackuswb_avx2(auVar110,auVar112);
          pauVar4[-3] = auVar112;
          auVar112 = *(undefined1 (*) [32])(pauVar8[-3] + 0x18);
          auVar28 = pauVar8[-2];
          auVar110 = vpshufb_avx2(auVar112,auVar46);
          auVar49 = vpshufb_avx2(auVar112,auVar63);
          auVar69 = vpshufb_avx2(auVar112,auVar79);
          auVar112 = vpmaddubsw_avx2(auVar110,auVar20);
          auVar110 = vpmaddubsw_avx2(auVar49,auVar27);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpmaddubsw_avx2(auVar69,auVar36);
          auVar49 = vpshufb_avx2(auVar28,auVar46);
          auVar69 = vpshufb_avx2(auVar28,auVar63);
          auVar82 = vpshufb_avx2(auVar28,auVar79);
          auVar28 = vpmaddubsw_avx2(auVar49,auVar20);
          auVar49 = vpmaddubsw_avx2(auVar69,auVar27);
          auVar28 = vpaddw_avx2(auVar28,auVar49);
          auVar49 = vpmaddubsw_avx2(auVar82,auVar36);
          auVar110 = vpaddw_avx2(auVar110,auVar92);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpsraw_avx2(auVar112,6);
          auVar112 = vpaddw_avx2(auVar49,auVar92);
          auVar112 = vpaddw_avx2(auVar28,auVar112);
          auVar112 = vpsraw_avx2(auVar112,6);
          auVar112 = vpackuswb_avx2(auVar110,auVar112);
          pauVar4[-2] = auVar112;
          auVar112 = *(undefined1 (*) [32])(pauVar8[-2] + 0x18);
          auVar28 = pauVar8[-1];
          auVar110 = vpshufb_avx2(auVar112,auVar46);
          auVar49 = vpshufb_avx2(auVar112,auVar63);
          auVar69 = vpshufb_avx2(auVar112,auVar79);
          auVar112 = vpmaddubsw_avx2(auVar110,auVar20);
          auVar110 = vpmaddubsw_avx2(auVar49,auVar27);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpmaddubsw_avx2(auVar69,auVar36);
          auVar49 = vpshufb_avx2(auVar28,auVar46);
          auVar69 = vpshufb_avx2(auVar28,auVar63);
          auVar82 = vpshufb_avx2(auVar28,auVar79);
          auVar28 = vpmaddubsw_avx2(auVar49,auVar20);
          auVar49 = vpmaddubsw_avx2(auVar69,auVar27);
          auVar28 = vpaddw_avx2(auVar28,auVar49);
          auVar49 = vpmaddubsw_avx2(auVar82,auVar36);
          auVar110 = vpaddw_avx2(auVar110,auVar92);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpsraw_avx2(auVar112,6);
          auVar112 = vpaddw_avx2(auVar49,auVar92);
          auVar112 = vpaddw_avx2(auVar28,auVar112);
          auVar112 = vpsraw_avx2(auVar112,6);
          auVar112 = vpackuswb_avx2(auVar110,auVar112);
          pauVar4[-1] = auVar112;
          auVar112 = *(undefined1 (*) [32])(pauVar8[-1] + 0x18);
          auVar28 = *pauVar8;
          auVar110 = vpshufb_avx2(auVar112,auVar46);
          auVar49 = vpshufb_avx2(auVar112,auVar63);
          auVar69 = vpshufb_avx2(auVar112,auVar79);
          auVar112 = vpmaddubsw_avx2(auVar110,auVar20);
          auVar110 = vpmaddubsw_avx2(auVar49,auVar27);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpmaddubsw_avx2(auVar69,auVar36);
          auVar49 = vpshufb_avx2(auVar28,auVar46);
          auVar69 = vpshufb_avx2(auVar28,auVar63);
          auVar82 = vpshufb_avx2(auVar28,auVar79);
          auVar28 = vpmaddubsw_avx2(auVar49,auVar20);
          auVar49 = vpmaddubsw_avx2(auVar69,auVar27);
          auVar28 = vpaddw_avx2(auVar28,auVar49);
          auVar49 = vpmaddubsw_avx2(auVar82,auVar36);
          auVar110 = vpaddw_avx2(auVar110,auVar92);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpsraw_avx2(auVar112,6);
          auVar112 = vpaddw_avx2(auVar49,auVar92);
          auVar112 = vpaddw_avx2(auVar28,auVar112);
          auVar112 = vpsraw_avx2(auVar112,6);
          auVar112 = vpackuswb_avx2(auVar110,auVar112);
          *pauVar4 = auVar112;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
          h = h + -1;
        } while (h != 0);
        break;
      case 3:
        pauVar4 = (undefined1 (*) [32])(src + 6);
        auVar43._16_16_ = _DAT_00513e00;
        auVar43._0_16_ = _DAT_00513e00;
        auVar60._16_16_ = _DAT_005139e0;
        auVar60._0_16_ = _DAT_005139e0;
        auVar76._16_16_ = _DAT_005139f0;
        auVar76._0_16_ = _DAT_005139f0;
        auVar89._8_2_ = 0x22;
        auVar89._0_8_ = 0x22002200220022;
        auVar89._10_2_ = 0x22;
        auVar89._12_2_ = 0x22;
        auVar89._14_2_ = 0x22;
        auVar89._16_2_ = 0x22;
        auVar89._18_2_ = 0x22;
        auVar89._20_2_ = 0x22;
        auVar89._22_2_ = 0x22;
        auVar89._24_2_ = 0x22;
        auVar89._26_2_ = 0x22;
        auVar89._28_2_ = 0x22;
        auVar89._30_2_ = 0x22;
        do {
          auVar112 = *(undefined1 (*) [32])(pauVar4[-1] + 0x18);
          auVar28 = *pauVar4;
          auVar110 = vpshufb_avx2(auVar112,auVar43);
          auVar49 = vpshufb_avx2(auVar112,auVar60);
          auVar69 = vpshufb_avx2(auVar112,auVar76);
          auVar112 = vpmaddubsw_avx2(auVar110,auVar20);
          auVar110 = vpmaddubsw_avx2(auVar49,auVar27);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpmaddubsw_avx2(auVar69,auVar36);
          auVar49 = vpshufb_avx2(auVar28,auVar43);
          auVar69 = vpshufb_avx2(auVar28,auVar60);
          auVar82 = vpshufb_avx2(auVar28,auVar76);
          auVar28 = vpmaddubsw_avx2(auVar49,auVar20);
          auVar49 = vpmaddubsw_avx2(auVar69,auVar27);
          auVar28 = vpaddw_avx2(auVar28,auVar49);
          auVar49 = vpmaddubsw_avx2(auVar82,auVar36);
          auVar110 = vpaddw_avx2(auVar110,auVar89);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpsraw_avx2(auVar112,6);
          auVar112 = vpaddw_avx2(auVar49,auVar89);
          auVar112 = vpaddw_avx2(auVar28,auVar112);
          auVar112 = vpsraw_avx2(auVar112,6);
          auVar112 = vpackuswb_avx2(auVar110,auVar112);
          *(undefined1 (*) [32])dst = auVar112;
          dst = *(undefined1 (*) [32])dst + dst_stride;
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + src_stride);
          h = h + -1;
        } while (h != 0);
        break;
      case 7:
        pauVar8 = (undefined1 (*) [32])(src + 0x26);
        pauVar4 = (undefined1 (*) [32])(dst + 0x20);
        auVar45._16_16_ = _DAT_00513e00;
        auVar45._0_16_ = _DAT_00513e00;
        auVar62._16_16_ = _DAT_005139e0;
        auVar62._0_16_ = _DAT_005139e0;
        auVar78._16_16_ = _DAT_005139f0;
        auVar78._0_16_ = _DAT_005139f0;
        auVar91._8_2_ = 0x22;
        auVar91._0_8_ = 0x22002200220022;
        auVar91._10_2_ = 0x22;
        auVar91._12_2_ = 0x22;
        auVar91._14_2_ = 0x22;
        auVar91._16_2_ = 0x22;
        auVar91._18_2_ = 0x22;
        auVar91._20_2_ = 0x22;
        auVar91._22_2_ = 0x22;
        auVar91._24_2_ = 0x22;
        auVar91._26_2_ = 0x22;
        auVar91._28_2_ = 0x22;
        auVar91._30_2_ = 0x22;
        do {
          auVar112 = *(undefined1 (*) [32])(pauVar8[-2] + 0x18);
          auVar28 = pauVar8[-1];
          auVar110 = vpshufb_avx2(auVar112,auVar45);
          auVar49 = vpshufb_avx2(auVar112,auVar62);
          auVar69 = vpshufb_avx2(auVar112,auVar78);
          auVar112 = vpmaddubsw_avx2(auVar110,auVar20);
          auVar110 = vpmaddubsw_avx2(auVar49,auVar27);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpmaddubsw_avx2(auVar69,auVar36);
          auVar49 = vpshufb_avx2(auVar28,auVar45);
          auVar69 = vpshufb_avx2(auVar28,auVar62);
          auVar82 = vpshufb_avx2(auVar28,auVar78);
          auVar28 = vpmaddubsw_avx2(auVar49,auVar20);
          auVar49 = vpmaddubsw_avx2(auVar69,auVar27);
          auVar28 = vpaddw_avx2(auVar28,auVar49);
          auVar49 = vpmaddubsw_avx2(auVar82,auVar36);
          auVar110 = vpaddw_avx2(auVar110,auVar91);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpsraw_avx2(auVar112,6);
          auVar112 = vpaddw_avx2(auVar49,auVar91);
          auVar112 = vpaddw_avx2(auVar28,auVar112);
          auVar112 = vpsraw_avx2(auVar112,6);
          auVar112 = vpackuswb_avx2(auVar110,auVar112);
          pauVar4[-1] = auVar112;
          auVar112 = *(undefined1 (*) [32])(pauVar8[-1] + 0x18);
          auVar28 = *pauVar8;
          auVar110 = vpshufb_avx2(auVar112,auVar45);
          auVar49 = vpshufb_avx2(auVar112,auVar62);
          auVar69 = vpshufb_avx2(auVar112,auVar78);
          auVar112 = vpmaddubsw_avx2(auVar110,auVar20);
          auVar110 = vpmaddubsw_avx2(auVar49,auVar27);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpmaddubsw_avx2(auVar69,auVar36);
          auVar49 = vpshufb_avx2(auVar28,auVar45);
          auVar69 = vpshufb_avx2(auVar28,auVar62);
          auVar82 = vpshufb_avx2(auVar28,auVar78);
          auVar28 = vpmaddubsw_avx2(auVar49,auVar20);
          auVar49 = vpmaddubsw_avx2(auVar69,auVar27);
          auVar28 = vpaddw_avx2(auVar28,auVar49);
          auVar49 = vpmaddubsw_avx2(auVar82,auVar36);
          auVar110 = vpaddw_avx2(auVar110,auVar91);
          auVar112 = vpaddw_avx2(auVar112,auVar110);
          auVar110 = vpsraw_avx2(auVar112,6);
          auVar112 = vpaddw_avx2(auVar49,auVar91);
          auVar112 = vpaddw_avx2(auVar28,auVar112);
          auVar112 = vpsraw_avx2(auVar112,6);
          auVar112 = vpackuswb_avx2(auVar110,auVar112);
          *pauVar4 = auVar112;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
          h = h + -1;
        } while (h != 0);
      }
    }
  }
  else {
    auVar34 = vpsraw_avx(*(undefined1 (*) [16])(piVar1 + uVar11),1);
    auVar67 = vpshufb_avx(auVar34,_DAT_00568300);
    auVar19._0_2_ = auVar67._0_2_;
    auVar19._2_2_ = auVar19._0_2_;
    auVar19._4_2_ = auVar19._0_2_;
    auVar19._6_2_ = auVar19._0_2_;
    auVar19._8_2_ = auVar19._0_2_;
    auVar19._10_2_ = auVar19._0_2_;
    auVar19._12_2_ = auVar19._0_2_;
    auVar19._14_2_ = auVar19._0_2_;
    auVar19._16_2_ = auVar19._0_2_;
    auVar19._18_2_ = auVar19._0_2_;
    auVar19._20_2_ = auVar19._0_2_;
    auVar19._22_2_ = auVar19._0_2_;
    auVar19._24_2_ = auVar19._0_2_;
    auVar19._26_2_ = auVar19._0_2_;
    auVar19._28_2_ = auVar19._0_2_;
    auVar19._30_2_ = auVar19._0_2_;
    auVar67 = vpshufb_avx(auVar34,_DAT_00568260);
    auVar26._0_2_ = auVar67._0_2_;
    auVar26._2_2_ = auVar26._0_2_;
    auVar26._4_2_ = auVar26._0_2_;
    auVar26._6_2_ = auVar26._0_2_;
    auVar26._8_2_ = auVar26._0_2_;
    auVar26._10_2_ = auVar26._0_2_;
    auVar26._12_2_ = auVar26._0_2_;
    auVar26._14_2_ = auVar26._0_2_;
    auVar26._16_2_ = auVar26._0_2_;
    auVar26._18_2_ = auVar26._0_2_;
    auVar26._20_2_ = auVar26._0_2_;
    auVar26._22_2_ = auVar26._0_2_;
    auVar26._24_2_ = auVar26._0_2_;
    auVar26._26_2_ = auVar26._0_2_;
    auVar26._28_2_ = auVar26._0_2_;
    auVar26._30_2_ = auVar26._0_2_;
    auVar67 = vpshufb_avx(auVar34,_DAT_00568270);
    auVar34 = vpshufb_avx(auVar34,_DAT_00568310);
    uVar33 = auVar67._0_2_;
    auVar35._2_2_ = uVar33;
    auVar35._0_2_ = uVar33;
    auVar35._4_2_ = uVar33;
    auVar35._6_2_ = uVar33;
    auVar35._8_2_ = uVar33;
    auVar35._10_2_ = uVar33;
    auVar35._12_2_ = uVar33;
    auVar35._14_2_ = uVar33;
    auVar35._16_2_ = uVar33;
    auVar35._18_2_ = uVar33;
    auVar35._20_2_ = uVar33;
    auVar35._22_2_ = uVar33;
    auVar35._24_2_ = uVar33;
    auVar35._26_2_ = uVar33;
    auVar35._28_2_ = uVar33;
    auVar35._30_2_ = uVar33;
    uVar33 = auVar34._0_2_;
    auVar41._2_2_ = uVar33;
    auVar41._0_2_ = uVar33;
    auVar41._4_2_ = uVar33;
    auVar41._6_2_ = uVar33;
    auVar41._8_2_ = uVar33;
    auVar41._10_2_ = uVar33;
    auVar41._12_2_ = uVar33;
    auVar41._14_2_ = uVar33;
    auVar41._16_2_ = uVar33;
    auVar41._18_2_ = uVar33;
    auVar41._20_2_ = uVar33;
    auVar41._22_2_ = uVar33;
    auVar41._24_2_ = uVar33;
    auVar41._26_2_ = uVar33;
    auVar41._28_2_ = uVar33;
    auVar41._30_2_ = uVar33;
    switch(w << 0x1d | w - 8U >> 3) {
    case 0:
      pauVar6 = (undefined1 (*) [16])(src + -3);
      auVar54._16_16_ = _DAT_00513e00;
      auVar54._0_16_ = _DAT_00513e00;
      auVar70._16_16_ = _DAT_005139e0;
      auVar70._0_16_ = _DAT_005139e0;
      auVar83._16_16_ = _DAT_005139f0;
      auVar83._0_16_ = _DAT_005139f0;
      auVar94._16_16_ = _DAT_00514830;
      auVar94._0_16_ = _DAT_00514830;
      auVar102._8_2_ = 0x22;
      auVar102._0_8_ = 0x22002200220022;
      auVar102._10_2_ = 0x22;
      auVar102._12_2_ = 0x22;
      auVar102._14_2_ = 0x22;
      auVar102._16_2_ = 0x22;
      auVar102._18_2_ = 0x22;
      auVar102._20_2_ = 0x22;
      auVar102._22_2_ = 0x22;
      auVar102._24_2_ = 0x22;
      auVar102._26_2_ = 0x22;
      auVar102._28_2_ = 0x22;
      auVar102._30_2_ = 0x22;
      do {
        auVar108._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
        auVar108._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
        auVar112 = vpshufb_avx2(auVar108,auVar54);
        auVar28 = vpshufb_avx2(auVar108,auVar70);
        auVar110 = vpshufb_avx2(auVar108,auVar83);
        auVar49 = vpshufb_avx2(auVar108,auVar94);
        auVar112 = vpmaddubsw_avx2(auVar112,auVar19);
        auVar28 = vpmaddubsw_avx2(auVar28,auVar26);
        auVar112 = vpaddw_avx2(auVar112,auVar28);
        auVar28 = vpmaddubsw_avx2(auVar110,auVar35);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar41);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar112 = vpaddw_avx2(auVar112,auVar28);
        auVar112 = vpaddw_avx2(auVar112,auVar102);
        auVar112 = vpsraw_avx2(auVar112,6);
        auVar112 = vpackuswb_avx2(auVar112,auVar19);
        *(long *)dst = auVar112._0_8_;
        *(long *)(dst + dst_stride) = auVar112._16_8_;
        pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
        dst = dst + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
      break;
    case 1:
      pauVar6 = (undefined1 (*) [16])(src + 5);
      auVar57._16_16_ = _DAT_00513e00;
      auVar57._0_16_ = _DAT_00513e00;
      auVar73._16_16_ = _DAT_005139e0;
      auVar73._0_16_ = _DAT_005139e0;
      auVar86._16_16_ = _DAT_005139f0;
      auVar86._0_16_ = _DAT_005139f0;
      auVar97._16_16_ = _DAT_00514830;
      auVar97._0_16_ = _DAT_00514830;
      auVar104._8_2_ = 0x22;
      auVar104._0_8_ = 0x22002200220022;
      auVar104._10_2_ = 0x22;
      auVar104._12_2_ = 0x22;
      auVar104._14_2_ = 0x22;
      auVar104._16_2_ = 0x22;
      auVar104._18_2_ = 0x22;
      auVar104._20_2_ = 0x22;
      auVar104._22_2_ = 0x22;
      auVar104._24_2_ = 0x22;
      auVar104._26_2_ = 0x22;
      auVar104._28_2_ = 0x22;
      auVar104._30_2_ = 0x22;
      do {
        auVar109._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 8) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + 8);
        auVar109._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar6[-1] + (long)src_stride + 8);
        auVar112 = vpshufb_avx2(auVar109,auVar57);
        auVar28 = vpshufb_avx2(auVar109,auVar73);
        auVar110 = vpshufb_avx2(auVar109,auVar86);
        auVar49 = vpshufb_avx2(auVar109,auVar97);
        auVar112 = vpmaddubsw_avx2(auVar112,auVar19);
        auVar28 = vpmaddubsw_avx2(auVar28,auVar26);
        auVar112 = vpaddw_avx2(auVar112,auVar28);
        auVar28 = vpmaddubsw_avx2(auVar110,auVar35);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar41);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar112 = vpaddw_avx2(auVar112,auVar28);
        auVar111._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar6 + src_stride) + ZEXT116(1) * *pauVar6;
        auVar111._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar6 + src_stride);
        auVar28 = vpshufb_avx2(auVar111,auVar57);
        auVar110 = vpshufb_avx2(auVar111,auVar73);
        auVar49 = vpshufb_avx2(auVar111,auVar86);
        auVar69 = vpshufb_avx2(auVar111,auVar97);
        auVar28 = vpmaddubsw_avx2(auVar28,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar110,auVar26);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar69,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar112 = vpaddw_avx2(auVar112,auVar104);
        auVar110 = vpsraw_avx2(auVar112,6);
        auVar112 = vpaddw_avx2(auVar28,auVar104);
        auVar112 = vpsraw_avx2(auVar112,6);
        auVar112 = vpackuswb_avx2(auVar110,auVar112);
        *(undefined1 (*) [16])dst = auVar112._0_16_;
        *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar112._16_16_;
        dst = *(undefined1 (*) [16])dst + dst_stride * 2;
        pauVar6 = (undefined1 (*) [16])(*pauVar6 + src_stride * 2);
        h = h + -2;
      } while (h != 0);
      break;
    default:
      pauVar8 = (undefined1 (*) [32])(src + 0x65);
      pauVar4 = (undefined1 (*) [32])(dst + 0x60);
      auVar59._16_16_ = _DAT_00513e00;
      auVar59._0_16_ = _DAT_00513e00;
      auVar75._16_16_ = _DAT_005139e0;
      auVar75._0_16_ = _DAT_005139e0;
      auVar88._16_16_ = _DAT_005139f0;
      auVar88._0_16_ = _DAT_005139f0;
      auVar99._16_16_ = _DAT_00514830;
      auVar99._0_16_ = _DAT_00514830;
      auVar106._8_2_ = 0x22;
      auVar106._0_8_ = 0x22002200220022;
      auVar106._10_2_ = 0x22;
      auVar106._12_2_ = 0x22;
      auVar106._14_2_ = 0x22;
      auVar106._16_2_ = 0x22;
      auVar106._18_2_ = 0x22;
      auVar106._20_2_ = 0x22;
      auVar106._22_2_ = 0x22;
      auVar106._24_2_ = 0x22;
      auVar106._26_2_ = 0x22;
      auVar106._28_2_ = 0x22;
      auVar106._30_2_ = 0x22;
      do {
        auVar112 = *(undefined1 (*) [32])(pauVar8[-4] + 0x18);
        auVar28 = pauVar8[-3];
        auVar110 = vpshufb_avx2(auVar112,auVar59);
        auVar49 = vpshufb_avx2(auVar112,auVar75);
        auVar69 = vpshufb_avx2(auVar112,auVar88);
        auVar82 = vpshufb_avx2(auVar112,auVar99);
        auVar112 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpshufb_avx2(auVar28,auVar59);
        auVar49 = vpshufb_avx2(auVar28,auVar75);
        auVar69 = vpshufb_avx2(auVar28,auVar88);
        auVar82 = vpshufb_avx2(auVar28,auVar99);
        auVar28 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar112 = vpaddw_avx2(auVar112,auVar106);
        auVar110 = vpsraw_avx2(auVar112,6);
        auVar112 = vpaddw_avx2(auVar28,auVar106);
        auVar112 = vpsraw_avx2(auVar112,6);
        auVar112 = vpackuswb_avx2(auVar110,auVar112);
        pauVar4[-3] = auVar112;
        auVar112 = *(undefined1 (*) [32])(pauVar8[-3] + 0x18);
        auVar28 = pauVar8[-2];
        auVar110 = vpshufb_avx2(auVar112,auVar59);
        auVar49 = vpshufb_avx2(auVar112,auVar75);
        auVar69 = vpshufb_avx2(auVar112,auVar88);
        auVar82 = vpshufb_avx2(auVar112,auVar99);
        auVar112 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpshufb_avx2(auVar28,auVar59);
        auVar49 = vpshufb_avx2(auVar28,auVar75);
        auVar69 = vpshufb_avx2(auVar28,auVar88);
        auVar82 = vpshufb_avx2(auVar28,auVar99);
        auVar28 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar112 = vpaddw_avx2(auVar112,auVar106);
        auVar110 = vpsraw_avx2(auVar112,6);
        auVar112 = vpaddw_avx2(auVar28,auVar106);
        auVar112 = vpsraw_avx2(auVar112,6);
        auVar112 = vpackuswb_avx2(auVar110,auVar112);
        pauVar4[-2] = auVar112;
        auVar112 = *(undefined1 (*) [32])(pauVar8[-2] + 0x18);
        auVar28 = pauVar8[-1];
        auVar110 = vpshufb_avx2(auVar112,auVar59);
        auVar49 = vpshufb_avx2(auVar112,auVar75);
        auVar69 = vpshufb_avx2(auVar112,auVar88);
        auVar82 = vpshufb_avx2(auVar112,auVar99);
        auVar112 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpshufb_avx2(auVar28,auVar59);
        auVar49 = vpshufb_avx2(auVar28,auVar75);
        auVar69 = vpshufb_avx2(auVar28,auVar88);
        auVar82 = vpshufb_avx2(auVar28,auVar99);
        auVar28 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar112 = vpaddw_avx2(auVar112,auVar106);
        auVar110 = vpsraw_avx2(auVar112,6);
        auVar112 = vpaddw_avx2(auVar28,auVar106);
        auVar112 = vpsraw_avx2(auVar112,6);
        auVar112 = vpackuswb_avx2(auVar110,auVar112);
        pauVar4[-1] = auVar112;
        auVar112 = *(undefined1 (*) [32])(pauVar8[-1] + 0x18);
        auVar28 = *pauVar8;
        auVar110 = vpshufb_avx2(auVar112,auVar59);
        auVar49 = vpshufb_avx2(auVar112,auVar75);
        auVar69 = vpshufb_avx2(auVar112,auVar88);
        auVar82 = vpshufb_avx2(auVar112,auVar99);
        auVar112 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpshufb_avx2(auVar28,auVar59);
        auVar49 = vpshufb_avx2(auVar28,auVar75);
        auVar69 = vpshufb_avx2(auVar28,auVar88);
        auVar82 = vpshufb_avx2(auVar28,auVar99);
        auVar28 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar112 = vpaddw_avx2(auVar112,auVar106);
        auVar110 = vpsraw_avx2(auVar112,6);
        auVar112 = vpaddw_avx2(auVar28,auVar106);
        auVar112 = vpsraw_avx2(auVar112,6);
        auVar112 = vpackuswb_avx2(auVar110,auVar112);
        *pauVar4 = auVar112;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
        h = h + -1;
      } while (h != 0);
      break;
    case 3:
      pauVar4 = (undefined1 (*) [32])(src + 5);
      auVar56._16_16_ = _DAT_00513e00;
      auVar56._0_16_ = _DAT_00513e00;
      auVar72._16_16_ = _DAT_005139e0;
      auVar72._0_16_ = _DAT_005139e0;
      auVar85._16_16_ = _DAT_005139f0;
      auVar85._0_16_ = _DAT_005139f0;
      auVar96._16_16_ = _DAT_00514830;
      auVar96._0_16_ = _DAT_00514830;
      auVar103._8_2_ = 0x22;
      auVar103._0_8_ = 0x22002200220022;
      auVar103._10_2_ = 0x22;
      auVar103._12_2_ = 0x22;
      auVar103._14_2_ = 0x22;
      auVar103._16_2_ = 0x22;
      auVar103._18_2_ = 0x22;
      auVar103._20_2_ = 0x22;
      auVar103._22_2_ = 0x22;
      auVar103._24_2_ = 0x22;
      auVar103._26_2_ = 0x22;
      auVar103._28_2_ = 0x22;
      auVar103._30_2_ = 0x22;
      do {
        auVar112 = *(undefined1 (*) [32])(pauVar4[-1] + 0x18);
        auVar28 = *pauVar4;
        auVar110 = vpshufb_avx2(auVar112,auVar56);
        auVar49 = vpshufb_avx2(auVar112,auVar72);
        auVar69 = vpshufb_avx2(auVar112,auVar85);
        auVar82 = vpshufb_avx2(auVar112,auVar96);
        auVar112 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpshufb_avx2(auVar28,auVar56);
        auVar49 = vpshufb_avx2(auVar28,auVar72);
        auVar69 = vpshufb_avx2(auVar28,auVar85);
        auVar82 = vpshufb_avx2(auVar28,auVar96);
        auVar28 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar112 = vpaddw_avx2(auVar112,auVar103);
        auVar110 = vpsraw_avx2(auVar112,6);
        auVar112 = vpaddw_avx2(auVar28,auVar103);
        auVar112 = vpsraw_avx2(auVar112,6);
        auVar112 = vpackuswb_avx2(auVar110,auVar112);
        *(undefined1 (*) [32])dst = auVar112;
        dst = *(undefined1 (*) [32])dst + dst_stride;
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + src_stride);
        h = h + -1;
      } while (h != 0);
      break;
    case 7:
      pauVar8 = (undefined1 (*) [32])(src + 0x25);
      pauVar4 = (undefined1 (*) [32])(dst + 0x20);
      auVar58._16_16_ = _DAT_00513e00;
      auVar58._0_16_ = _DAT_00513e00;
      auVar74._16_16_ = _DAT_005139e0;
      auVar74._0_16_ = _DAT_005139e0;
      auVar87._16_16_ = _DAT_005139f0;
      auVar87._0_16_ = _DAT_005139f0;
      auVar98._16_16_ = _DAT_00514830;
      auVar98._0_16_ = _DAT_00514830;
      auVar105._8_2_ = 0x22;
      auVar105._0_8_ = 0x22002200220022;
      auVar105._10_2_ = 0x22;
      auVar105._12_2_ = 0x22;
      auVar105._14_2_ = 0x22;
      auVar105._16_2_ = 0x22;
      auVar105._18_2_ = 0x22;
      auVar105._20_2_ = 0x22;
      auVar105._22_2_ = 0x22;
      auVar105._24_2_ = 0x22;
      auVar105._26_2_ = 0x22;
      auVar105._28_2_ = 0x22;
      auVar105._30_2_ = 0x22;
      do {
        auVar112 = *(undefined1 (*) [32])(pauVar8[-2] + 0x18);
        auVar28 = pauVar8[-1];
        auVar110 = vpshufb_avx2(auVar112,auVar58);
        auVar49 = vpshufb_avx2(auVar112,auVar74);
        auVar69 = vpshufb_avx2(auVar112,auVar87);
        auVar82 = vpshufb_avx2(auVar112,auVar98);
        auVar112 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpshufb_avx2(auVar28,auVar58);
        auVar49 = vpshufb_avx2(auVar28,auVar74);
        auVar69 = vpshufb_avx2(auVar28,auVar87);
        auVar82 = vpshufb_avx2(auVar28,auVar98);
        auVar28 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar112 = vpaddw_avx2(auVar112,auVar105);
        auVar110 = vpsraw_avx2(auVar112,6);
        auVar112 = vpaddw_avx2(auVar28,auVar105);
        auVar112 = vpsraw_avx2(auVar112,6);
        auVar112 = vpackuswb_avx2(auVar110,auVar112);
        pauVar4[-1] = auVar112;
        auVar112 = *(undefined1 (*) [32])(pauVar8[-1] + 0x18);
        auVar28 = *pauVar8;
        auVar110 = vpshufb_avx2(auVar112,auVar58);
        auVar49 = vpshufb_avx2(auVar112,auVar74);
        auVar69 = vpshufb_avx2(auVar112,auVar87);
        auVar82 = vpshufb_avx2(auVar112,auVar98);
        auVar112 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar112 = vpaddw_avx2(auVar112,auVar110);
        auVar110 = vpshufb_avx2(auVar28,auVar58);
        auVar49 = vpshufb_avx2(auVar28,auVar74);
        auVar69 = vpshufb_avx2(auVar28,auVar87);
        auVar82 = vpshufb_avx2(auVar28,auVar98);
        auVar28 = vpmaddubsw_avx2(auVar110,auVar19);
        auVar110 = vpmaddubsw_avx2(auVar49,auVar26);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar110 = vpmaddubsw_avx2(auVar69,auVar35);
        auVar49 = vpmaddubsw_avx2(auVar82,auVar41);
        auVar110 = vpaddw_avx2(auVar110,auVar49);
        auVar28 = vpaddw_avx2(auVar28,auVar110);
        auVar112 = vpaddw_avx2(auVar112,auVar105);
        auVar110 = vpsraw_avx2(auVar112,6);
        auVar112 = vpaddw_avx2(auVar28,auVar105);
        auVar112 = vpsraw_avx2(auVar112,6);
        auVar112 = vpackuswb_avx2(auVar110,auVar112);
        *pauVar4 = auVar112;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + src_stride);
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + dst_stride);
        h = h + -1;
      } while (h != 0);
    }
  }
  return;
}

Assistant:

void av1_convolve_x_sr_avx2(const uint8_t *src, int32_t src_stride,
                            uint8_t *dst, int32_t dst_stride, int32_t w,
                            int32_t h,
                            const InterpFilterParams *filter_params_x,
                            const int32_t subpel_x_qn,
                            ConvolveParams *conv_params) {
#if CONFIG_SVT_AV1
  const int horz_tap = get_filter_tap(filter_params_x, subpel_x_qn);

  if (horz_tap == 12) {
    av1_convolve_x_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_x, subpel_x_qn, conv_params);
  } else {
    av1_convolve_x_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                       filter_params_x, subpel_x_qn,
                                       conv_params);
  }
#else
  av1_convolve_x_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_x, subpel_x_qn, conv_params);
#endif
}